

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O3

void __thiscall spdlog::logger::sink_it_(logger *this,log_msg *msg)

{
  pointer psVar1;
  element_type *peVar2;
  char *__end;
  pointer psVar3;
  
  psVar1 = (this->sinks_).
           super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->sinks_).
                super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    peVar2 = (psVar3->super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((peVar2->level_).super___atomic_base<int>._M_i <= (int)msg->level) {
      (*peVar2->_vptr_sink[2])(peVar2,msg);
    }
  }
  if ((this->flush_level_).super___atomic_base<int>._M_i <= (int)msg->level && msg->level != off) {
    (*this->_vptr_logger[4])(this);
  }
  return;
}

Assistant:

SPDLOG_INLINE void logger::sink_it_(const details::log_msg &msg)
{
    for (auto &sink : sinks_)
    {
        if (sink->should_log(msg.level))
        {
            SPDLOG_TRY
            {
                sink->log(msg);
            }
            SPDLOG_LOGGER_CATCH()
        }
    }